

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O1

__pid_t __thiscall kmp_flag_oncore::wait(kmp_flag_oncore *this,void *__stat_loc)

{
  kmp_int32 gtid;
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  undefined1 *puVar7;
  int in_EDX;
  int iVar8;
  int tasks_completed;
  kmp_uint32 local_64;
  int local_54;
  unsigned_long_long *local_50;
  ulong local_48;
  void *local_40;
  unsigned_long_long local_38;
  
  local_50 = (this->super_kmp_flag<unsigned_long_long>).loc;
  local_40 = this->itt_sync_obj;
  local_54 = 0;
  local_38 = *(this->super_kmp_flag<unsigned_long_long>).loc;
  if (this->checker == (ulong)*(byte *)((long)&local_38 + (ulong)this->offset)) {
    puVar7 = __kmp_itt_fsync_acquired_ptr__3_0;
    if (0 < __kmp_itt_prepare_delay || __kmp_itt_fsync_acquired_ptr__3_0 == (undefined1 *)0x0)
    goto LAB_00140c21;
  }
  else {
    gtid = *(kmp_int32 *)((long)__stat_loc + 0x24);
    local_64 = __kmp_yield_init;
    if (__kmp_dflt_blocktime != 0x7fffffff) {
      lVar5 = __kmp_hardware_timestamp();
      local_48 = lVar5 + *(long *)((long)__stat_loc + 0x88);
    }
    iVar3 = __kmp_nth;
    iVar2 = __kmp_avail_proc;
    iVar8 = 0;
    do {
      bVar4 = notdone_check(this);
      if (!bVar4) break;
      if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_00140ab1:
        lVar5 = 0;
      }
      else {
        lVar5 = *(long *)((long)__stat_loc + 0x170);
        if (lVar5 == 0) {
          *(undefined4 *)((long)__stat_loc + 0x198) = 1;
          goto LAB_00140ab1;
        }
        if (*(int *)(lVar5 + 0xc0) == 0) {
          *(undefined8 *)((long)__stat_loc + 0x170) = 0;
LAB_00140ac1:
          *(undefined4 *)((long)__stat_loc + 0x198) = 1;
        }
        else {
          if (*(int *)(lVar5 + 0x50) != 1) goto LAB_00140ac1;
          __kmp_execute_tasks_oncore((kmp_info_t *)__stat_loc,gtid,this,in_EDX,&local_54,local_40,0)
          ;
        }
      }
      if (((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
          (iVar8 < __kmp_itt_prepare_delay)) &&
         (iVar8 = iVar8 + 1, __kmp_itt_prepare_delay <= iVar8)) {
        (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(local_50);
      }
      if (__kmp_global.g.g_done == 0) {
        if (iVar2 < iVar3) {
          __kmp_yield(1);
        }
        else {
          local_64 = local_64 - 2;
          if (local_64 == 0) {
            __kmp_yield(1);
            local_64 = __kmp_yield_next;
          }
        }
        iVar1 = *(int *)((long)__stat_loc + 0x60);
        if ((*(char *)((long)__stat_loc + 0x19c) == '\0') == (iVar1 != 0)) {
          if (iVar1 == 0) {
            LOCK();
            __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + -1;
            UNLOCK();
          }
          else {
            LOCK();
            __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + 1;
            UNLOCK();
          }
          *(bool *)((long)__stat_loc + 0x19c) = iVar1 != 0;
        }
        if (((__kmp_dflt_blocktime != 0x7fffffff) && ((lVar5 == 0 || (*(int *)(lVar5 + 0x50) == 0)))
            ) && (uVar6 = __kmp_hardware_timestamp(), local_48 <= uVar6)) {
          __kmp_suspend_oncore(gtid,this);
          if (__kmp_global.g.g_done != 0) goto LAB_00140afc;
          if ((__kmp_tasking_mode != tskm_immediate_exec) &&
             (*(int *)((long)__stat_loc + 0x198) == 1)) {
            *(undefined4 *)((long)__stat_loc + 0x198) = 0;
          }
        }
        bVar4 = false;
      }
      else {
LAB_00140afc:
        bVar4 = true;
        if (__kmp_global.g.g_abort != 0) {
          __kmp_abort_thread();
        }
      }
    } while (!bVar4);
    puVar7 = __kmp_itt_fsync_acquired_ptr__3_0;
    if (__kmp_itt_fsync_acquired_ptr__3_0 == (undefined1 *)0x0 || iVar8 < __kmp_itt_prepare_delay)
    goto LAB_00140c21;
  }
  puVar7 = (undefined1 *)(*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(local_50);
LAB_00140c21:
  return (__pid_t)puVar7;
}

Assistant:

void wait(kmp_info_t *this_thr, int final_spin) {
    __kmp_wait_template<kmp_flag_oncore>(
        this_thr, this, final_spin USE_ITT_BUILD_ARG(itt_sync_obj));
  }